

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkInterface * __thiscall
cmGeneratorTarget::GetImportLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *headTarget,
          LinkInterfaceFor interfaceFor,bool secondPass)

{
  _Base_ptr p_Var1;
  cmBTStringRange entries;
  cmBTStringRange entries_00;
  cmBTStringRange entries_01;
  cmGeneratorTarget *this_00;
  ImportInfo *pIVar2;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_01;
  cmLinkInterface *iface;
  pointer n;
  string_view arg;
  string_view arg_00;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorTarget *local_170;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_168;
  cmLinkInterface *local_150;
  LookupLinkItemScope scope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  optional<cmLinkItem> maybeItem;
  
  headTarget_local = headTarget;
  local_170 = this;
  pIVar2 = GetImportInfo(this,config);
  if (pIVar2 == (ImportInfo *)0x0) {
    local_150 = (cmLinkInterface *)0x0;
  }
  else {
    if (interfaceFor == Usage) {
      this_01 = &GetHeadToLinkInterfaceUsageRequirementsMap(local_170,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    else {
      this_01 = &GetHeadToLinkInterfaceMap(local_170,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    if (((this_01->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (p_Var1 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)&p_Var1[4]._M_parent == '\0')) {
      headTarget_local = *(cmGeneratorTarget **)(p_Var1 + 1);
    }
    iface = &std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::operator[](this_01,&headTarget_local)->super_cmLinkInterface;
    if (secondPass) {
      memset((cmLinkInterface *)&maybeItem,0,0xf8);
      cmOptionalLinkInterface::cmOptionalLinkInterface((cmOptionalLinkInterface *)&maybeItem);
      cmOptionalLinkInterface::operator=
                ((cmOptionalLinkInterface *)iface,(cmOptionalLinkInterface *)&maybeItem);
      cmLinkInterface::~cmLinkInterface((cmLinkInterface *)&maybeItem);
    }
    local_150 = iface;
    if (iface->field_0xf3 == '\0') {
      *(undefined2 *)&iface->field_0xf2 = 0x101;
      iface->Multiplicity = pIVar2->Multiplicity;
      arg_00._M_str = (pIVar2->Languages)._M_dataplus._M_p;
      arg_00._M_len = (pIVar2->Languages)._M_string_length;
      cmExpandList(arg_00,&iface->Languages,false);
      this_00 = local_170;
      entries.Begin._M_current =
           (pIVar2->LibrariesHeadInclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries.End._M_current =
           (pIVar2->LibrariesHeadInclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(local_170,
                      (string *)(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,
                      entries,config,headTarget_local,interfaceFor,HeadInclude,iface);
      entries_00.Begin._M_current =
           (pIVar2->LibrariesHeadExclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries_00.End._M_current =
           (pIVar2->LibrariesHeadExclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(this_00,(string *)
                              (anonymous_namespace)::
                              kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,entries_00,config,
                      headTarget_local,interfaceFor,HeadExclude,iface);
      entries_01.Begin._M_current =
           (pIVar2->Libraries).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries_01.End._M_current =
           (pIVar2->Libraries).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(this_00,&pIVar2->LibrariesProp,entries_01,config,headTarget_local,interfaceFor
                      ,Libraries,iface);
      arg._M_str = (pIVar2->SharedDeps)._M_dataplus._M_p;
      arg._M_len = (pIVar2->SharedDeps)._M_string_length;
      cmExpandedList_abi_cxx11_(&deps,arg,false);
      scope.LG = this_00->LocalGenerator;
      for (n = deps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          n != deps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; n = n + 1) {
        local_168.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_168.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_168);
        LookupLinkItem(&maybeItem,local_170,n,(cmListFileBacktrace *)&local_168,&scope,No);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_168.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
            super__Optional_payload<cmLinkItem,_true,_false,_false>.
            super__Optional_payload_base<cmLinkItem>._M_engaged == true) {
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                    (&iface->SharedDeps,(cmLinkItem *)&maybeItem);
        }
        std::_Optional_payload_base<cmLinkItem>::_M_reset
                  ((_Optional_payload_base<cmLinkItem> *)&maybeItem);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deps);
    }
  }
  return local_150;
}

Assistant:

const cmLinkInterface* cmGeneratorTarget::GetImportLinkInterface(
  const std::string& config, cmGeneratorTarget const* headTarget,
  LinkInterfaceFor interfaceFor, bool secondPass) const
{
  cmGeneratorTarget::ImportInfo const* info = this->GetImportInfo(config);
  if (!info) {
    return nullptr;
  }

  cmHeadToLinkInterfaceMap& hm =
    (interfaceFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    headTarget = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[headTarget];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    iface.LibrariesDone = true;
    iface.Multiplicity = info->Multiplicity;
    cmExpandList(info->Languages, iface.Languages);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          cmMakeRange(info->LibrariesHeadInclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          cmMakeRange(info->LibrariesHeadExclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
    this->ExpandLinkItems(info->LibrariesProp, cmMakeRange(info->Libraries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
    std::vector<std::string> deps = cmExpandedList(info->SharedDeps);
    LookupLinkItemScope scope{ this->LocalGenerator };
    for (std::string const& dep : deps) {
      if (cm::optional<cmLinkItem> maybeItem = this->LookupLinkItem(
            dep, cmListFileBacktrace(), &scope, LookupSelf::No)) {
        iface.SharedDeps.emplace_back(std::move(*maybeItem));
      }
    }
  }

  return &iface;
}